

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,FamilyType v)

{
  int iVar1;
  FamilyType v_local;
  string *s;
  
  iVar1 = (int)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"partition");
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"nonOverlapping");
  }
  else if (iVar1 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"unrestricted");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomSubset::FamilyType v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomSubset::FamilyType::Partition: {
      s = "partition";
      break;
    }
    case tinyusdz::GeomSubset::FamilyType::NonOverlapping: {
      s = "nonOverlapping";
      break;
    }
    case tinyusdz::GeomSubset::FamilyType::Unrestricted: {
      s = "unrestricted";
      break;
    }
  }

  return s;
}